

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dataflow.cpp
# Opt level: O2

Variable * __thiscall nwcpp::Dataflow::DeclareVariable(Dataflow *this,string *name)

{
  Passkey PVar1;
  ostream *poVar2;
  runtime_error *this_00;
  pair<std::_Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nwcpp::Variable_*>_>,_bool>
  pVar3;
  Passkey local_1d0;
  Passkey passkey;
  string local_1c0 [32];
  stringstream msg;
  ostream local_190 [16];
  Dataflow *local_180;
  
  passkey.dag = this;
  std::make_unique<nwcpp::Variable,nwcpp::Passkey&,std::__cxx11::string_const&>
            (&local_1d0,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&passkey);
  PVar1.dag = local_1d0.dag;
  std::__cxx11::string::string
            ((string *)&msg,
             (string *)
             &((local_1d0.dag)->variables_)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent);
  local_180 = PVar1.dag;
  pVar3 = std::
          _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,nwcpp::Variable*>,std::_Select1st<std::pair<std::__cxx11::string_const,nwcpp::Variable*>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,nwcpp::Variable*>>>
          ::_M_insert_unique<std::pair<std::__cxx11::string_const,nwcpp::Variable*>>
                    ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,nwcpp::Variable*>,std::_Select1st<std::pair<std::__cxx11::string_const,nwcpp::Variable*>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,nwcpp::Variable*>>>
                      *)this,(pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nwcpp::Variable_*>
                              *)&msg);
  std::__cxx11::string::~string((string *)&msg);
  _msg = (pointer)local_1d0.dag;
  if (((undefined1  [16])pVar3 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
    local_1d0.dag = (Dataflow *)0x0;
    std::
    vector<std::unique_ptr<nwcpp::Node,std::default_delete<nwcpp::Node>>,std::allocator<std::unique_ptr<nwcpp::Node,std::default_delete<nwcpp::Node>>>>
    ::emplace_back<std::unique_ptr<nwcpp::Node,std::default_delete<nwcpp::Node>>>
              ((vector<std::unique_ptr<nwcpp::Node,std::default_delete<nwcpp::Node>>,std::allocator<std::unique_ptr<nwcpp::Node,std::default_delete<nwcpp::Node>>>>
                *)&this->nodes_,(unique_ptr<nwcpp::Node,_std::default_delete<nwcpp::Node>_> *)&msg);
    if ((Dataflow *)_msg != (Dataflow *)0x0) {
      (**(code **)(*(long *)_msg + 8))();
    }
    if (local_1d0.dag != (Dataflow *)0x0) {
      (**(code **)(*(long *)&((local_1d0.dag)->variables_)._M_t._M_impl + 8))();
    }
    return (Variable *)PVar1.dag;
  }
  std::__cxx11::stringstream::stringstream((stringstream *)&msg);
  poVar2 = std::operator<<(local_190,"Duplicate variable name (\'");
  poVar2 = std::operator<<(poVar2,(string *)
                                  &((local_1d0.dag)->variables_)._M_t._M_impl.super__Rb_tree_header.
                                   _M_header._M_parent);
  std::operator<<(poVar2,"\')");
  this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
  std::__cxx11::stringbuf::str();
  std::runtime_error::runtime_error(this_00,local_1c0);
  __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

Variable* Dataflow::DeclareVariable(const std::string& name) {
  Passkey passkey(this);
  auto var = std::make_unique<Variable>(passkey, name);
  const auto ptr = var.get();
  if (!variables_.insert({ var->name(), ptr }).second) {
    std::stringstream msg;
    msg << "Duplicate variable name ('" << var->name() << "')";
    throw std::runtime_error(msg.str());
  }
  nodes_.push_back(std::move(var));
  return ptr;
}